

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall
YAML::SingleDocParser::HandleFlowMap(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  Token *pTVar2;
  undefined8 uVar3;
  string *msg_;
  long *in_RSI;
  Token *nextToken;
  EventHandler *in_stack_00000098;
  SingleDocParser *in_stack_000000a0;
  Mark mark;
  Token *token;
  value in_stack_fffffffffffffeac;
  Scanner *in_stack_fffffffffffffeb0;
  Mark *in_stack_fffffffffffffeb8;
  Mark *mark_;
  Scanner *in_stack_fffffffffffffec0;
  allocator *this_00;
  allocator local_e9;
  string local_e8 [32];
  Token *local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  Mark local_98;
  Mark local_88;
  undefined8 local_7c;
  int local_74;
  Token *local_70;
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  Mark local_40;
  Mark local_20;
  long *local_10;
  
  local_10 = in_RSI;
  Scanner::pop(in_stack_fffffffffffffeb0);
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf268ab);
  CollectionStack::PushCollectionType
            ((CollectionStack *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  while( true ) {
    bVar1 = Scanner::empty(in_stack_fffffffffffffeb0);
    if (bVar1) {
      local_62 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      local_40 = Scanner::mark(in_stack_fffffffffffffec0);
      local_20 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"end of map flow not found",&local_61);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (string *)in_stack_fffffffffffffeb0);
      local_62 = 0;
      __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
    }
    local_70 = Scanner::peek(in_stack_fffffffffffffeb0);
    local_7c._0_4_ = (local_70->mark).pos;
    local_7c._4_4_ = (local_70->mark).line;
    local_74 = (local_70->mark).column;
    if (local_70->type == FLOW_MAP_END) break;
    if (local_70->type == KEY) {
      Scanner::pop(in_stack_fffffffffffffeb0);
      HandleNode(in_stack_000000a0,in_stack_00000098);
    }
    else {
      (**(code **)(*local_10 + 0x20))(local_10,&local_7c,0);
    }
    bVar1 = Scanner::empty(in_stack_fffffffffffffeb0);
    if ((bVar1) || (pTVar2 = Scanner::peek(in_stack_fffffffffffffeb0), pTVar2->type != VALUE)) {
      (**(code **)(*local_10 + 0x20))(local_10,&local_7c,0);
    }
    else {
      Scanner::pop(in_stack_fffffffffffffeb0);
      HandleNode(in_stack_000000a0,in_stack_00000098);
    }
    bVar1 = Scanner::empty(in_stack_fffffffffffffeb0);
    if (bVar1) {
      local_ba = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      local_98 = Scanner::mark(in_stack_fffffffffffffec0);
      local_88 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"end of map flow not found",&local_b9);
      ParserException::ParserException
                ((ParserException *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (string *)in_stack_fffffffffffffeb0);
      local_ba = 0;
      __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
    }
    local_c8 = Scanner::peek(in_stack_fffffffffffffeb0);
    if (local_c8->type == FLOW_ENTRY) {
      Scanner::pop(in_stack_fffffffffffffeb0);
    }
    else if (local_c8->type != FLOW_MAP_END) {
      msg_ = (string *)__cxa_allocate_exception(0x40);
      mark_ = &local_c8->mark;
      this_00 = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"end of map flow not found",this_00);
      ParserException::ParserException((ParserException *)this_00,mark_,msg_);
      __cxa_throw(msg_,&ParserException::typeinfo,ParserException::~ParserException);
    }
  }
  Scanner::pop(in_stack_fffffffffffffeb0);
  std::unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>::operator->
            ((unique_ptr<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_> *)
             0xf26db4);
  CollectionStack::PopCollectionType
            ((CollectionStack *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  return;
}

Assistant:

void SingleDocParser::HandleFlowMap(EventHandler& eventHandler) {
  // eat start token
  m_scanner.pop();
  m_pCollectionStack->PushCollectionType(CollectionType::FlowMap);

  while (true) {
    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP_FLOW);

    Token& token = m_scanner.peek();
    const Mark mark = token.mark;
    // first check for end
    if (token.type == Token::FLOW_MAP_END) {
      m_scanner.pop();
      break;
    }

    // grab key (if non-null)
    if (token.type == Token::KEY) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(mark, NullAnchor);
    }

    // now grab value (optional)
    if (!m_scanner.empty() && m_scanner.peek().type == Token::VALUE) {
      m_scanner.pop();
      HandleNode(eventHandler);
    } else {
      eventHandler.OnNull(mark, NullAnchor);
    }

    if (m_scanner.empty())
      throw ParserException(m_scanner.mark(), ErrorMsg::END_OF_MAP_FLOW);

    // now eat the separator (or could be a map end, which we ignore - but if
    // it's neither, then it's a bad node)
    Token& nextToken = m_scanner.peek();
    if (nextToken.type == Token::FLOW_ENTRY)
      m_scanner.pop();
    else if (nextToken.type != Token::FLOW_MAP_END)
      throw ParserException(nextToken.mark, ErrorMsg::END_OF_MAP_FLOW);
  }

  m_pCollectionStack->PopCollectionType(CollectionType::FlowMap);
}